

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long in_RSI;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_58;
  sockaddr local_54;
  socklen_t local_44;
  timeval tv;
  
  iVar2 = (int)ctx;
  if (iVar2 < 2) {
    log_set_level(1);
    load_local_record(&cacheset,"dnsrelay.txt");
    iVar2 = 1000;
    local_58 = 0;
  }
  else {
    iVar6 = iVar2 + -1;
    iVar7 = 0;
    iVar8 = 1;
    local_58 = 0;
    iVar1 = 0;
    do {
      pcVar4 = *(char **)(in_RSI + (long)iVar8 * 8);
      if (*pcVar4 != '-') {
LAB_00105ded:
        dnsExit();
        goto LAB_00105df2;
      }
      if ((pcVar4[1] == 'd') && (pcVar4[2] == '\0')) {
        if (iVar8 == iVar6) goto LAB_00105ded;
      }
      else if ((pcVar4[1] == 'f') && (pcVar4[2] == '\0')) {
        if (iVar8 == iVar6) goto LAB_00105ded;
        iVar7 = iVar8 + 1;
      }
      else if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) {
        if (iVar8 == iVar6) goto LAB_00105ded;
        local_58 = iVar8 + 1;
      }
      else {
        if ((pcVar4[1] != 'c') || ((pcVar4[2] != '\0' || (iVar8 == iVar6)))) goto LAB_00105ded;
        iVar1 = atoi(*(char **)(in_RSI + 8 + (long)iVar8 * 8));
      }
      iVar8 = iVar8 + 2;
    } while (iVar8 < iVar2);
    log_set_level(1);
    if (iVar7 == 0) {
      pcVar4 = "dnsrelay.txt";
    }
    else {
      pcVar4 = *(char **)(in_RSI + (long)iVar7 * 8);
    }
    load_local_record(&cacheset,pcVar4);
    iVar2 = 1000;
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
  }
  init_A_record_cache(&cacheset.A.temp,iVar2,0x19999999,0.7);
  init_A_record_cache(&cacheset.AAAA.temp,iVar2,0x19999999,0.7);
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x1f8,"init cache done");
  if (local_58 == 0) {
    pcVar4 = "10.3.9.4";
  }
  else {
    pcVar4 = *(char **)(in_RSI + (long)local_58 * 8);
  }
  memset(&query_server,0,0x10);
  query_server.sin_family = 2;
  query_server.sin_port = 0x3500;
  inet_pton(2,pcVar4,&query_server.sin_addr);
  signal(0xd,(__sighandler_t)0x1);
  server_sockfd = socket(2,2,0);
  if (server_sockfd < 0) {
LAB_00105df2:
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    pcVar5 = "socket open error";
    iVar2 = 0x212;
  }
  else {
    log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
            ,0x214,"server accept IPV4 connection only");
    query_sockfd = socket(2,2,0);
    if (query_sockfd < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar5 = "socket open error";
      iVar2 = 0x218;
    }
    else {
      tv.tv_sec = 1;
      tv.tv_usec = 0;
      iVar2 = setsockopt(query_sockfd,1,0x14,&tv,0x10);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0x21f,"set timeout error",pcVar4);
      }
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x221,"setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x229,"init all done");
      local_54.sa_data[6] = '\0';
      local_54.sa_data[7] = '\0';
      local_54.sa_data[8] = '\0';
      local_54.sa_data[9] = '\0';
      local_54.sa_data[10] = '\0';
      local_54.sa_data[0xb] = '\0';
      local_54.sa_data[0xc] = '\0';
      local_54.sa_data[0xd] = '\0';
      local_54.sa_family = 2;
      local_54.sa_data[0] = '\0';
      local_54.sa_data[1] = '5';
      local_54.sa_data[2] = '\0';
      local_54.sa_data[3] = '\0';
      local_54.sa_data[4] = '\0';
      local_54.sa_data[5] = '\0';
      iVar2 = bind(server_sockfd,&local_54,0x10);
      if (-1 < iVar2) {
        local_44 = 0x10;
        iVar2 = getsockname(server_sockfd,&local_54,&local_44);
        if (iVar2 == -1) {
          perror("getsockname");
        }
        else {
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0x8a,"%s %d:%d:%d:%d:port:%d ","listen on ",(ulong)local_54._0_8_ >> 0x20 & 0xff,
                  (ulong)local_54._0_8_ >> 0x28 & 0xff,(ulong)local_54._0_8_ >> 0x30 & 0xff,
                  (ulong)local_54._0_8_ >> 0x38,
                  (ulong)(ushort)(local_54.sa_data._0_2_ << 8 | (ushort)local_54.sa_data._0_2_ >> 8)
                 );
        }
        iVar2 = pthread_rwlock_init((pthread_rwlock_t *)&IDAdapter.rwlock,
                                    (pthread_rwlockattr_t *)0x0);
        return iVar2;
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar5 = "bind error";
      iVar2 = 0x19d;
    }
  }
  log_log(5,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          iVar2,"%s:%s",pcVar5,pcVar4);
  exit(1);
}

Assistant:

void init(int argc,char **argv) {
  int debug_lev=0,cache_num=0,dns_server=0,file=0;
  for(int i=1;i<argc;i++){
    if(!strcmp(argv[i],"-d")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        debug_lev=++i;
      }
    }
    else if(!strcmp(argv[i],"-f")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        file=++i;
      }
    }
    else if(!strcmp(argv[i],"-s")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        dns_server=++i;
      }
    }
    else if(!strcmp(argv[i],"-c")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        cache_num=atoi(argv[++i]);
      }
    }
    else{
        dnsExit();
    }
  }
  log_set_level(LOG_DEBUG);
  // log_set_level(debug_lev!=0?atoi(argv[debug_lev]):2);
  load_local_record(&cacheset,file==0?"dnsrelay.txt":argv[file]);
  init_A_record_cache(&cacheset.A.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  init_A_record_cache(&cacheset.AAAA.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  log_info("init cache done");

  init_query_server(dns_server==0?"10.3.9.4":argv[dns_server]);
  #ifdef _WIN64
    WSADATA wsaData;
    if(WSAStartup(MAKEWORD(2,2),&wsaData)!=0){//协商版本winsock 2.2
      log_fatal_exit_shortcut("winsock init error");
    }
    system("chcp 65001");//修改控制台格式为65001
  #endif
  #ifdef __linux
    signal(SIGPIPE, SIG_IGN);
    //忽略管道破裂
  #endif
  // signal(SIGINT,handle_)
  #ifdef ACCEPT_IPV6_REQUEST
  int no = 0;  
  if( (server_sockfd = socket(PF_INET6, SOCK_DGRAM, 0))<0){
    log_fatal_exit_shortcut("socket open error");
  }
  if (setsockopt(server_sockfd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&no, sizeof(no))<0){
    log_fatal_shortcut("failed set ipv6 only off:");
  }
  log_info("server accept IPV6 and IPV4 connection");
  #else
  if( (server_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  log_info("server accept IPV4 connection only");
  #endif

  if( (query_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  #ifdef __linux
  struct timeval tv;
  tv.tv_sec = 1;
  tv.tv_usec = 0;
  if (setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO,&tv,sizeof(tv)) < 0) {
      log_error("set timeout error",strerror(errno));
  }
  log_info("setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
  #elif defined(_WIN64)
  DWORD timeout = 1 * 1000;//设置超时时间
  if(setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO, (const char*)&timeout, sizeof timeout)<0){
      log_error_shortcut("set timeout error");
  }
  log_info("setting timeout = %d ms",timeout);
  #endif
  log_info("init all done");
  bind_addr();
  pthread_rwlock_init(&IDAdapter.rwlock, NULL);
}